

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-cluster.c
# Opt level: O1

int lunpackrequest(lua_State *L)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  byte *pbVar4;
  char *fmt;
  ulong uVar5;
  size_t len;
  uint uVar6;
  size_t ssz;
  ulong local_38;
  
  local_38 = in_RAX;
  pbVar4 = (byte *)luaL_checklstring(L,1,&local_38);
  bVar1 = *pbVar4;
  uVar6 = (uint)local_38;
  if (bVar1 < 2) {
    if (bVar1 == 0) {
      if (8 < (int)uVar6) {
        uVar2 = *(uint *)(pbVar4 + 5);
        lua_pushinteger(L,(ulong)*(uint *)(pbVar4 + 1));
        lua_pushinteger(L,(ulong)uVar2);
        pbVar4 = pbVar4 + 9;
        len = (size_t)(uVar6 - 9);
LAB_00116e47:
        lua_pushlstring(L,(char *)pbVar4,len);
        return 3;
      }
      goto LAB_00116dea;
    }
    if (bVar1 != 1) {
LAB_00116d33:
      local_38 = (ulong)(uint)(int)(char)bVar1;
      fmt = "Invalid req package type %d";
      goto LAB_00116df7;
    }
    if (uVar6 == 0xd) {
      uVar6 = *(uint *)(pbVar4 + 5);
      uVar2 = *(uint *)(pbVar4 + 9);
      lua_pushinteger(L,(ulong)*(uint *)(pbVar4 + 1));
      lua_pushinteger(L,(ulong)uVar6);
LAB_00116d05:
      lua_pushinteger(L,(ulong)uVar2);
      uVar6 = 1;
LAB_00116dc0:
      lua_pushboolean(L,uVar6);
      return 4;
    }
    fmt = "Invalid cluster message size %d (multi req must be 13)";
  }
  else {
    if (bVar1 - 2 < 2) {
      if ((int)uVar6 < 5) {
        iVar3 = luaL_error(L,"Invalid cluster multi part message");
        return iVar3;
      }
      uVar2 = *(uint *)(pbVar4 + 1);
      lua_pushboolean(L,0);
      lua_pushinteger(L,(ulong)uVar2);
      lua_pushlstring(L,(char *)(pbVar4 + 5),(ulong)(uVar6 - 5));
      uVar6 = (uint)(bVar1 == 2);
      goto LAB_00116dc0;
    }
    if (bVar1 == 0x80) {
      if (1 < (int)uVar6) {
        uVar5 = (ulong)pbVar4[1];
        if (pbVar4[1] + 6 <= (uVar6 & 0x7fffffff)) {
          lua_pushlstring(L,(char *)(pbVar4 + 2),uVar5);
          lua_pushinteger(L,(ulong)*(uint *)(pbVar4 + uVar5 + 2));
          pbVar4 = pbVar4 + uVar5 + 6;
          len = ((uVar6 & 0x7fffffff) - uVar5) - 6;
          goto LAB_00116e47;
        }
      }
    }
    else {
      if (bVar1 != 0x81) goto LAB_00116d33;
      if ((1 < (int)uVar6) && (uVar5 = (ulong)pbVar4[1], pbVar4[1] + 10 <= (uVar6 & 0x7fffffff))) {
        lua_pushlstring(L,(char *)(pbVar4 + 2),uVar5);
        uVar2 = *(uint *)(pbVar4 + uVar5 + 6);
        lua_pushinteger(L,(ulong)*(uint *)(pbVar4 + uVar5 + 2));
        goto LAB_00116d05;
      }
    }
LAB_00116dea:
    fmt = "Invalid cluster message (size=%d)";
  }
  local_38 = local_38 & 0xffffffff;
LAB_00116df7:
  iVar3 = luaL_error(L,fmt,local_38);
  return iVar3;
}

Assistant:

static int
lunpackrequest(lua_State *L) {
	size_t ssz;
	const char *msg = luaL_checklstring(L,1,&ssz);
	int sz = (int)ssz;
	switch (msg[0]) {
	case 0:
		return unpackreq_number(L, (const uint8_t *)msg, sz);
	case 1:
		return unpackmreq_number(L, (const uint8_t *)msg, sz);
	case 2:
	case 3:
		return unpackmreq_part(L, (const uint8_t *)msg, sz);
	case '\x80':
		return unpackreq_string(L, (const uint8_t *)msg, sz);
	case '\x81':
		return unpackmreq_string(L, (const uint8_t *)msg, sz);
	default:
		return luaL_error(L, "Invalid req package type %d", msg[0]);
	}
}